

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::verifyLevelsAreEqual
               (DeepImageLevel *level1,DeepImageLevel *level2,int dx,int dy)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Box2i *pBVar5;
  ArgExc *pAVar6;
  ostream *poVar7;
  string *psVar8;
  DeepImageChannel *pDVar9;
  int in_ECX;
  int in_EDX;
  ImageLevel *in_RSI;
  ImageLevel *in_RDI;
  ConstIterator i2;
  ConstIterator i1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  bool local_e1;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar10;
  DeepImageChannel *in_stack_ffffffffffffff90;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
  iVar14 = (pBVar5->min).x;
  pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
  if (iVar14 == (pBVar5->min).x - in_EDX) {
    pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
    iVar13 = (pBVar5->min).y;
    pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
    if (iVar13 == (pBVar5->min).y - in_ECX) {
      pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
      iVar12 = (pBVar5->max).x;
      pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
      if (iVar12 == (pBVar5->max).x - in_EDX) {
        pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RDI);
        iVar11 = (pBVar5->max).y;
        pBVar5 = Imf_3_2::ImageLevel::dataWindow(in_RSI);
        if (iVar11 == (pBVar5->max).y - in_ECX) {
          Imf_3_2::DeepImageLevel::begin();
          Imf_3_2::DeepImageLevel::begin();
          while( true ) {
            Imf_3_2::DeepImageLevel::end();
            bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                        (ConstIterator *)in_stack_ffffffffffffff08);
            uVar10 = false;
            if (bVar1) {
              Imf_3_2::DeepImageLevel::end();
              uVar10 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                           (ConstIterator *)in_stack_ffffffffffffff08);
            }
            if ((bool)uVar10 == false) {
              Imf_3_2::DeepImageLevel::end();
              bVar1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                          (ConstIterator *)in_stack_ffffffffffffff08);
              local_e1 = true;
              if (!bVar1) {
                Imf_3_2::DeepImageLevel::end();
                local_e1 = Imf_3_2::operator!=((ConstIterator *)in_stack_ffffffffffffff10,
                                               (ConstIterator *)in_stack_ffffffffffffff08);
              }
              if (local_e1 != false) {
                pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_2::ArgExc::ArgExc(pAVar6,"different channel lists");
                __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
              }
              return;
            }
            poVar7 = std::operator<<((ostream *)&std::cout,"            channel ");
            psVar8 = Imf_3_2::DeepImageLevel::ConstIterator::name_abi_cxx11_
                               ((ConstIterator *)0x1156aa);
            poVar7 = std::operator<<(poVar7,(string *)psVar8);
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            psVar8 = Imf_3_2::DeepImageLevel::ConstIterator::name_abi_cxx11_
                               ((ConstIterator *)0x1156d3);
            Imf_3_2::DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x1156e5);
            bVar1 = std::operator!=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
            if (bVar1) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar6,"different channel names");
              __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115763);
            iVar3 = (*(code *)**(undefined8 **)pDVar9)();
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11577c);
            iVar4 = (*(code *)**(undefined8 **)pDVar9)();
            if (iVar3 != iVar4) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar6,"different channel types");
              __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1157f9);
            iVar3 = Imf_3_2::ImageChannel::xSampling((ImageChannel *)pDVar9);
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115812);
            iVar4 = Imf_3_2::ImageChannel::xSampling((ImageChannel *)pDVar9);
            if (iVar3 != iVar4) break;
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115831);
            iVar3 = Imf_3_2::ImageChannel::ySampling((ImageChannel *)pDVar9);
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x11584a);
            iVar4 = Imf_3_2::ImageChannel::ySampling((ImageChannel *)pDVar9);
            if (iVar3 != iVar4) break;
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1158c7);
            bVar1 = Imf_3_2::ImageChannel::pLinear((ImageChannel *)pDVar9);
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1158e5);
            bVar2 = Imf_3_2::ImageChannel::pLinear((ImageChannel *)pDVar9);
            if (bVar1 != bVar2) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_2::ArgExc::ArgExc(pAVar6,"different channel types");
              __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
            }
            pDVar9 = Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115968);
            iVar3 = (*(code *)**(undefined8 **)pDVar9)();
            if (iVar3 == 0) {
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115a24);
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x115a36);
              verifyPixelsAreEqual<unsigned_int>
                        (in_stack_ffffffffffffff90,
                         (DeepImageChannel *)CONCAT17(uVar10,in_stack_ffffffffffffff88),
                         (int)((ulong)psVar8 >> 0x20),(int)psVar8);
            }
            else if (iVar3 == 1) {
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1159a9);
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1159bb);
              verifyPixelsAreEqual<Imath_3_2::half>
                        ((DeepImageChannel *)CONCAT44(iVar14,iVar13),
                         (DeepImageChannel *)CONCAT44(iVar12,iVar11),
                         (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                         (int)in_stack_ffffffffffffff90);
            }
            else {
              if (iVar3 != 2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                              ,0x72,
                              "void (anonymous namespace)::verifyLevelsAreEqual(const DeepImageLevel &, const DeepImageLevel &, int, int)"
                             );
              }
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1159e8);
              Imf_3_2::DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1159fa);
              verifyPixelsAreEqual<float>
                        (in_stack_ffffffffffffff90,
                         (DeepImageChannel *)CONCAT17(uVar10,in_stack_ffffffffffffff88),
                         (int)((ulong)psVar8 >> 0x20),(int)psVar8);
            }
            Imf_3_2::DeepImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff10);
            Imf_3_2::DeepImageLevel::ConstIterator::operator++
                      ((ConstIterator *)in_stack_ffffffffffffff10);
          }
          pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::ArgExc::ArgExc(pAVar6,"different channel sampling rates");
          __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
        }
      }
    }
  }
  pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::ArgExc::ArgExc(pAVar6,"different data windows");
  __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
}

Assistant:

void
verifyLevelsAreEqual (
    const DeepImageLevel& level1, const DeepImageLevel& level2, int dx, int dy)
{
    if (level1.dataWindow ().min.x != level2.dataWindow ().min.x - dx ||
        level1.dataWindow ().min.y != level2.dataWindow ().min.y - dy ||
        level1.dataWindow ().max.x != level2.dataWindow ().max.x - dx ||
        level1.dataWindow ().max.y != level2.dataWindow ().max.y - dy)
    {
        throw ArgExc ("different data windows");
    }

    DeepImageLevel::ConstIterator i1 = level1.begin ();
    DeepImageLevel::ConstIterator i2 = level2.begin ();

    while (i1 != level1.end () && i2 != level2.end ())
    {
        cout << "            channel " << i1.name () << endl;

        if (i1.name () != i2.name ()) throw ArgExc ("different channel names");

        if (i1.channel ().pixelType () != i2.channel ().pixelType ())
            throw ArgExc ("different channel types");

        if (i1.channel ().xSampling () != i2.channel ().xSampling () ||
            i1.channel ().ySampling () != i2.channel ().ySampling ())
            throw ArgExc ("different channel sampling rates");

        if (i1.channel ().pLinear () != i2.channel ().pLinear ())
            throw ArgExc ("different channel types");

        switch (i1.channel ().pixelType ())
        {
            case HALF:

                verifyPixelsAreEqual<half> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case FLOAT:

                verifyPixelsAreEqual<float> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            case UINT:

                verifyPixelsAreEqual<unsigned int> (
                    i1.channel (), i2.channel (), dx, dy);

                break;

            default: assert (false);
        }

        ++i1;
        ++i2;
    }

    if (i1 != level1.end () || i2 != level2.end ())
        throw ArgExc ("different channel lists");
}